

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall testing::StrictMock<dying_buffer>::StrictMock(StrictMock<dying_buffer> *this)

{
  dying_buffer::dying_buffer(&this->super_dying_buffer);
  (this->super_dying_buffer).super_test_buffer<int>.super_basic_buffer<int>._vptr_basic_buffer =
       (_func_int **)&PTR_grow_001b71b8;
  Mock::FailUninterestingCalls(this);
  return;
}

Assistant:

StrictMock() {
    ::testing::Mock::FailUninterestingCalls(
        internal::ImplicitCast_<MockClass*>(this));
  }